

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManPoXSim(Gia_Man_t *p,int nFrames,int fVerbose)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  bool bVar2;
  int local_34;
  int local_30;
  int nLeft;
  int k;
  int f;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRes;
  int fVerbose_local;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  local_34 = Gia_ManPoNum(p);
  iVar1 = Gia_ManPoNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManPoNum(p);
  Vec_IntFill(p_00,iVar1,nFrames);
  pObj_00 = Gia_ManConst0(p);
  Gia_ObjTerSimSet0(pObj_00);
  local_30 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar2 = false;
    if (local_30 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _k = Gia_ManCo(p,iVar1 + local_30);
      bVar2 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Gia_ObjTerSimSet0(_k);
    local_30 = local_30 + 1;
  }
  for (nLeft = 0; nLeft < nFrames; nLeft = nLeft + 1) {
    local_30 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar2 = false;
      if (local_30 < iVar1) {
        _k = Gia_ManCi(p,local_30);
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      Gia_ObjTerSimSetX(_k);
      local_30 = local_30 + 1;
    }
    local_30 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar2 = false;
      if (local_30 < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        _k = Gia_ManCi(p,iVar1 + local_30);
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      Gia_ObjTerSimRo(p,_k);
      local_30 = local_30 + 1;
    }
    local_30 = 0;
    while( true ) {
      bVar2 = false;
      if (local_30 < p->nObjs) {
        _k = Gia_ManObj(p,local_30);
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        Gia_ObjTerSimAnd(_k);
      }
      local_30 = local_30 + 1;
    }
    local_30 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar2 = false;
      if (local_30 < iVar1) {
        _k = Gia_ManCo(p,local_30);
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      Gia_ObjTerSimCo(_k);
      local_30 = local_30 + 1;
    }
    if (fVerbose != 0) {
      local_30 = 0;
      while( true ) {
        iVar1 = Gia_ManPoNum(p);
        bVar2 = false;
        if (local_30 < iVar1) {
          _k = Gia_ManCo(p,local_30);
          bVar2 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar2) break;
        Gia_ObjTerSimPrint(_k);
        local_30 = local_30 + 1;
      }
      printf("\n");
    }
    local_30 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar2 = false;
      if (local_30 < iVar1) {
        _k = Gia_ManCo(p,local_30);
        bVar2 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Vec_IntEntry(p_00,local_30);
      if ((iVar1 == nFrames) && (iVar1 = Gia_ObjTerSimGetX(_k), iVar1 != 0)) {
        Vec_IntWriteEntry(p_00,local_30,nLeft);
        local_34 = local_34 + -1;
      }
      local_30 = local_30 + 1;
    }
    if (local_34 == 0) break;
  }
  if (fVerbose != 0) {
    if (local_34 == 0) {
      printf("Simulation converged after %d frames.\n",(ulong)(nLeft + 1));
    }
    else {
      printf("Simulation terminated after %d frames.\n",(ulong)(uint)nFrames);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManPoXSim( Gia_Man_t * p, int nFrames, int fVerbose )
{
    Vec_Int_t * vRes;
    Gia_Obj_t * pObj;
    int f, k, nLeft = Gia_ManPoNum(p);
    vRes = Vec_IntAlloc( Gia_ManPoNum(p) );
    Vec_IntFill( vRes, Gia_ManPoNum(p), nFrames );
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            Gia_ObjTerSimSetX( pObj );
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
        if ( fVerbose )
        {
            Gia_ManForEachPo( p, pObj, k )
                Gia_ObjTerSimPrint( pObj );
            printf( "\n" );
        }
        Gia_ManForEachPo( p, pObj, k )
            if ( Vec_IntEntry(vRes, k) == nFrames && Gia_ObjTerSimGetX(pObj) )
                Vec_IntWriteEntry(vRes, k, f), nLeft--;
        if ( nLeft == 0 )
            break;
    }
    if ( fVerbose )
    {
        if ( nLeft == 0 )
            printf( "Simulation converged after %d frames.\n", f+1 );
        else
            printf( "Simulation terminated after %d frames.\n", nFrames );
    }        
//    Vec_IntPrint( vRes );
    return vRes;
}